

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iinq.c
# Opt level: O3

ion_status_t iinq_delete(char *schema_file_name,ion_key_t key)

{
  byte bVar1;
  ion_status_t iVar2;
  byte bVar3;
  ulong uVar4;
  ion_dictionary_t dictionary;
  ion_dictionary_handler_t handler;
  ion_dictionary_t iStack_78;
  ion_dictionary_handler_t local_60;
  
  iStack_78.handler = &local_60;
  bVar1 = iinq_open_source(schema_file_name,&iStack_78,iStack_78.handler);
  if (bVar1 == 0) {
    iVar2 = dictionary_delete(&iStack_78,key);
    bVar1 = ion_close_dictionary(&iStack_78);
    bVar3 = iVar2.error;
    if (bVar1 == 0) {
      bVar1 = bVar3;
    }
    if (bVar3 != 0) {
      bVar1 = bVar3;
    }
    uVar4 = (ulong)iVar2 & 0xffffffffffffff00;
  }
  else {
    uVar4 = 0;
  }
  return (ion_status_t)(bVar1 | uVar4);
}

Assistant:

ion_status_t
iinq_delete(
	char		*schema_file_name,
	ion_key_t	key
) {
	ion_err_t					error;
	ion_status_t				status = ION_STATUS_INITIALIZE;
	ion_dictionary_t			dictionary;
	ion_dictionary_handler_t	handler;

	dictionary.handler	= &handler;

	error				= iinq_open_source(schema_file_name, &dictionary, &handler);

	if (err_ok != error) {
		status = ION_STATUS_ERROR(error);
		goto RETURN;
	}

	status	= dictionary_delete(&dictionary, key);
	error	= ion_close_dictionary(&dictionary);

	if ((err_ok == status.error) && (err_ok != error)) {
		status.error = error;
	}

RETURN: return status;
}